

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stdio.cpp
# Opt level: O1

int main(void)

{
  long *__old;
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  string example;
  ostringstream ss;
  char buf [16];
  wstring wexample;
  string local_220 [32];
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  long *local_1e0 [2];
  long local_1d0 [45];
  int local_68;
  short local_64;
  long *local_50 [2];
  long local_40 [2];
  
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,anon_var_dwarf_3dde,anon_var_dwarf_3dde + 0xc);
  local_50[0] = local_40;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_50,L"ש-м-ν.txt",L"");
  pFVar2 = fopen((char *)local_200,"w");
  if (pFVar2 == (FILE *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Error f in ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
               ,0x61);
    local_220[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e0,(char *)local_220,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_220);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fwrite("test\n",5,1,pFVar2);
  fclose(pFVar2);
  pFVar2 = fopen((char *)local_200,"r");
  if (pFVar2 == (FILE *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,"Error (f=nowide::fopen(example.c_str(),\"r\"))!=0 in ",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
               ,0x61);
    local_220[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e0,(char *)local_220,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_220);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = fgets((char *)&local_68,0x10,pFVar2);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,"Error std::fgets(buf,16,f)!=0 in ",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
               ,0x61);
    local_220[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e0,(char *)local_220,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_220);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_64 != 10 || local_68 != 0x74736574) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,"Error strcmp(buf,\"test\\n\")==0 in ",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
               ,0x61);
    local_220[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e0,(char *)local_220,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_220);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pFVar2 = freopen((char *)local_200,"r+",pFVar2);
  if (pFVar2 == (FILE *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,"Error (f=nowide::freopen(example.c_str(),\"r+\",f))!=0 in ",
               0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
               ,0x61);
    local_220[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e0,(char *)local_220,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_220);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fclose(pFVar2);
  __old = local_200;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,local_200,(long)local_200 + local_1f8);
  std::__cxx11::string::append((char *)local_1e0);
  iVar1 = rename((char *)__old,(char *)local_1e0[0]);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,
               "Error nowide::rename(example.c_str(),(example+\".1\").c_str())==0 in ",0x43);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
               ,0x61);
    local_220[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e0,(char *)local_220,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_220);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = remove((char *)local_200);
  if (-1 < iVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,"Error nowide::remove(example.c_str())<0 in ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
               ,0x61);
    local_220[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e0,(char *)local_220,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_220);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,local_200,(long)local_200 + local_1f8);
  std::__cxx11::string::append((char *)local_1e0);
  pFVar2 = fopen((char *)local_1e0[0],"r");
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  if (pFVar2 != (FILE *)0x0) {
    fclose(pFVar2);
    iVar1 = remove((char *)local_200);
    if (-1 < iVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e0,"Error nowide::remove(example.c_str())<0 in ",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                 ,0x61);
      local_220[0] = (string)0x3a;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1e0,(char *)local_220,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_220);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1e0[0] = local_1d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e0,local_200,(long)local_200 + local_1f8);
    std::__cxx11::string::append((char *)local_1e0);
    iVar1 = remove((char *)local_1e0[0]);
    if (local_1e0[0] != local_1d0) {
      operator_delete(local_1e0[0],local_1d0[0] + 1);
    }
    if (iVar1 == 0) {
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] * 4 + 4);
      }
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,"Error nowide::remove((example+\".1\").c_str())==0 in ",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
               ,0x61);
    local_220[0] = (string)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e0,(char *)local_220,1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_220);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e0,"Error (f=nowide::fopen((example+\".1\").c_str(),\"r\"))!=0 in ",
             0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
             ,0x61);
  local_220[0] = (string)0x3a;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1e0,(char *)local_220,1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"main",4);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,local_220);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    try {
        std::string example = "\xd7\xa9-\xd0\xbc-\xce\xbd.txt";
        std::wstring wexample = L"\u05e9-\u043c-\u03bd.txt";

        #ifdef NOWIDE_WINDOWS
        FILE *f=_wfopen(wexample.c_str(),L"w");
        #else
        FILE *f=std::fopen(example.c_str(),"w");
        #endif
        TEST(f);
        std::fprintf(f,"test\n");
        std::fclose(f);
        f=0;
        
        TEST((f=nowide::fopen(example.c_str(),"r"))!=0);
        char buf[16];
        TEST(std::fgets(buf,16,f)!=0);
        TEST(strcmp(buf,"test\n")==0);
        TEST((f=nowide::freopen(example.c_str(),"r+",f))!=0);
        std::fclose(f);
        f=0;
        
        TEST(nowide::rename(example.c_str(),(example+".1").c_str())==0);
        TEST(nowide::remove(example.c_str())<0);
        TEST((f=nowide::fopen((example+".1").c_str(),"r"))!=0);
        std::fclose(f);
        f=0;
        TEST(nowide::remove(example.c_str())<0);
        TEST(nowide::remove((example+".1").c_str())==0);
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return 1;
    }
    std::cout << "Ok" << std::endl;
    return 0;
}